

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int SaveEXRMultipartImageToFile
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,char *filename,char **err
              )

{
  char *pcVar1;
  FILE *__s;
  size_t __n;
  size_t sVar2;
  long *plVar3;
  long *plVar4;
  long *__s_00;
  uchar *mem;
  allocator local_71;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  if ((exr_headers == (EXRHeader **)0x0 || exr_images == (EXRImage *)0x0) || num_parts < 2) {
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Invalid argument for SaveEXRMultipartImageToFile","");
    plVar3 = local_70;
    if (err != (char **)0x0) {
      pcVar1 = strdup((char *)local_70);
      *err = pcVar1;
    }
    if (plVar3 != &local_60) {
      operator_delete(plVar3);
    }
    return -3;
  }
  __s = fopen(filename,"wb");
  if (__s == (FILE *)0x0) {
    std::__cxx11::string::string((string *)local_50,filename,&local_71);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x256432);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_60 = *plVar4;
      lStack_58 = plVar3[3];
      __s_00 = &local_60;
    }
    else {
      local_60 = *plVar4;
      __s_00 = (long *)*plVar3;
    }
    local_68 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_70 = __s_00;
    if (err != (char **)0x0) {
      pcVar1 = strdup((char *)__s_00);
      *err = pcVar1;
    }
    if (__s_00 != &local_60) {
      operator_delete(__s_00);
    }
    plVar3 = local_50[0];
    if (local_50[0] == local_40) {
      return -0xb;
    }
  }
  else {
    local_50[0] = (long *)0x0;
    __n = SaveEXRMultipartImageToMemory(exr_images,exr_headers,num_parts,(uchar **)local_50,err);
    if (__n == 0) {
      return -0xc;
    }
    if (local_50[0] == (long *)0x0) {
      plVar3 = (long *)0x0;
      sVar2 = 0;
    }
    else {
      sVar2 = fwrite(local_50[0],1,__n,__s);
      plVar3 = local_50[0];
    }
    free(plVar3);
    fclose(__s);
    if (sVar2 == __n) {
      return 0;
    }
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Cannot write a file","");
    plVar3 = local_70;
    if (err != (char **)0x0) {
      pcVar1 = strdup((char *)local_70);
      *err = pcVar1;
    }
    if (plVar3 == &local_60) {
      return -0xb;
    }
  }
  operator_delete(plVar3);
  return -0xb;
}

Assistant:

int SaveEXRMultipartImageToFile(const EXRImage* exr_images,
                                const EXRHeader** exr_headers,
                                unsigned int num_parts,
                                const char* filename,
                                const char** err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts < 2) {
    tinyexr::SetErrorMessage("Invalid argument for SaveEXRMultipartImageToFile",
                              err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  FILE *fp = NULL;
#ifdef _WIN32
#if defined(_MSC_VER) || (defined(MINGW_HAS_SECURE_API) && MINGW_HAS_SECURE_API) // MSVC, MinGW GCC, or Clang.
  errno_t errcode =
    _wfopen_s(&fp, tinyexr::UTF8ToWchar(filename).c_str(), L"wb");
  if (errcode != 0) {
    tinyexr::SetErrorMessage("Cannot write a file: " + std::string(filename),
                             err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }
#else
  // Unknown compiler or MinGW without MINGW_HAS_SECURE_API.
  fp = fopen(filename, "wb");
#endif
#else
  fp = fopen(filename, "wb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot write a file: " + std::string(filename),
                             err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  unsigned char *mem = NULL;
  size_t mem_size = SaveEXRMultipartImageToMemory(exr_images, exr_headers, num_parts, &mem, err);
  if (mem_size == 0) {
    return TINYEXR_ERROR_SERIALIZATION_FAILED;
  }

  size_t written_size = 0;
  if ((mem_size > 0) && mem) {
    written_size = fwrite(mem, 1, mem_size, fp);
  }
  free(mem);

  fclose(fp);

  if (written_size != mem_size) {
    tinyexr::SetErrorMessage("Cannot write a file", err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  return TINYEXR_SUCCESS;
}